

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

OPJ_BOOL opj_pi_next_cprl(opj_pi_iterator_t *pi)

{
  char cVar1;
  OPJ_UINT32 OVar2;
  OPJ_INT32 OVar3;
  OPJ_INT32 OVar4;
  OPJ_INT32 OVar5;
  OPJ_INT32 OVar6;
  uint uVar7;
  opj_pi_resolution_t *poVar8;
  int *piVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  OPJ_UINT32 local_6c;
  OPJ_UINT32 local_64;
  OPJ_INT32 prcj;
  OPJ_INT32 prci;
  OPJ_UINT32 rpy;
  OPJ_UINT32 rpx;
  OPJ_INT32 try1;
  OPJ_INT32 trx1;
  OPJ_INT32 try0;
  OPJ_INT32 trx0;
  OPJ_UINT32 levelno;
  OPJ_UINT32 dy;
  OPJ_UINT32 dx;
  OPJ_UINT32 resno;
  OPJ_UINT32 index;
  opj_pi_resolution_t *res;
  opj_pi_comp_t *comp;
  opj_pi_iterator_t *pi_local;
  
  if (pi->first != 0) {
    pi->first = 0;
    pi->compno = (pi->poc).compno0;
    goto LAB_0013b898;
  }
  res = (opj_pi_resolution_t *)(pi->comps + pi->compno);
  do {
    pi->layno = pi->layno + 1;
    while ((pi->poc).layno1 <= pi->layno) {
      do {
        do {
          pi->resno = pi->resno + 1;
          while (uVar7 = pi->resno, OVar2 = opj_uint_min((pi->poc).resno1,res->pw), OVar2 <= uVar7)
          {
            pi->x = (pi->dx - pi->x % (int)pi->dx) + pi->x;
            while ((pi->poc).tx1 <= pi->x) {
              pi->y = (pi->dy - pi->y % (int)pi->dy) + pi->y;
              while ((pi->poc).ty1 <= pi->y) {
                pi->compno = pi->compno + 1;
LAB_0013b898:
                if ((pi->poc).compno1 <= pi->compno) {
                  return 0;
                }
                res = (opj_pi_resolution_t *)(pi->comps + pi->compno);
                pi->dx = 0;
                pi->dy = 0;
                for (dy = 0; dy < ((opj_pi_comp_t *)res)->numresolutions; dy = dy + 1) {
                  poVar8 = ((opj_pi_comp_t *)res)->resolutions + dy;
                  cVar1 = (char)dy;
                  if (((poVar8->pdx + ((opj_pi_comp_t *)res)->numresolutions + -1) - dy < 0x20) &&
                     (((opj_pi_comp_t *)res)->dx <=
                      (uint)(0xffffffff /
                            (ulong)(uint)(1 << (((char)poVar8->pdx +
                                                 (char)((opj_pi_comp_t *)res)->numresolutions + -1)
                                                - cVar1 & 0x1fU))))) {
                    local_64 = ((opj_pi_comp_t *)res)->dx *
                               (1 << (((char)poVar8->pdx +
                                       (char)((opj_pi_comp_t *)res)->numresolutions + -1) - cVar1 &
                                     0x1fU));
                    if (pi->dx != 0) {
                      local_64 = opj_uint_min(pi->dx,local_64);
                    }
                    pi->dx = local_64;
                  }
                  if (((poVar8->pdy + ((opj_pi_comp_t *)res)->numresolutions + -1) - dy < 0x20) &&
                     (((opj_pi_comp_t *)res)->dy <=
                      (uint)(0xffffffff /
                            (ulong)(uint)(1 << (((char)poVar8->pdy +
                                                 (char)((opj_pi_comp_t *)res)->numresolutions + -1)
                                                - cVar1 & 0x1fU))))) {
                    local_6c = ((opj_pi_comp_t *)res)->dy *
                               (1 << (((char)poVar8->pdy +
                                       (char)((opj_pi_comp_t *)res)->numresolutions + -1) - cVar1 &
                                     0x1fU));
                    if (pi->dy != 0) {
                      local_6c = opj_uint_min(pi->dy,local_6c);
                    }
                    pi->dy = local_6c;
                  }
                }
                if ((pi->dx == 0) || (pi->dy == 0)) {
                  return 0;
                }
                if (pi->tp_on == '\0') {
                  (pi->poc).ty0 = pi->ty0;
                  (pi->poc).tx0 = pi->tx0;
                  (pi->poc).ty1 = pi->ty1;
                  (pi->poc).tx1 = pi->tx1;
                }
                pi->y = (pi->poc).ty0;
              }
              pi->x = (pi->poc).tx0;
            }
            pi->resno = (pi->poc).resno0;
          }
          piVar9 = (int *)(*(long *)(res + 1) + (ulong)pi->resno * 0x10);
          uVar7 = (res->pw - 1) - pi->resno;
        } while ((((0x1f < uVar7) ||
                  (bVar10 = (byte)uVar7,
                  (res->pdx << (bVar10 & 0x1f)) >> (bVar10 & 0x1f) != res->pdx)) ||
                 ((res->pdy << (bVar10 & 0x1f)) >> (bVar10 & 0x1f) != res->pdy)) ||
                ((0x7fffffff < res->pdx << (bVar10 & 0x1f) ||
                 (0x7fffffff < res->pdy << (bVar10 & 0x1f)))));
        OVar3 = opj_int_ceildiv(pi->tx0,res->pdx << (bVar10 & 0x1f));
        OVar4 = opj_int_ceildiv(pi->ty0,res->pdy << (bVar10 & 0x1f));
        OVar5 = opj_int_ceildiv(pi->tx1,res->pdx << (bVar10 & 0x1f));
        OVar6 = opj_int_ceildiv(pi->ty1,res->pdy << (bVar10 & 0x1f));
      } while (((((0x1e < *piVar9 + uVar7) ||
                 ((bVar11 = (byte)(*piVar9 + uVar7),
                  (res->pdx << (bVar11 & 0x1f)) >> (bVar11 & 0x1f) != res->pdx ||
                  (0x1e < piVar9[1] + uVar7)))) ||
                ((bVar12 = (byte)(piVar9[1] + uVar7),
                 (res->pdy << (bVar12 & 0x1f)) >> (bVar12 & 0x1f) != res->pdy ||
                 ((pi->y % (int)(res->pdy << (bVar12 & 0x1f)) != 0 &&
                  ((pi->y != pi->ty0 || ((OVar4 << (bVar10 & 0x1f)) % (1 << (bVar12 & 0x1f)) == 0)))
                  ))))) ||
               ((pi->x % (int)(res->pdx << (bVar11 & 0x1f)) != 0 &&
                ((pi->x != pi->tx0 || ((OVar3 << (bVar10 & 0x1f)) % (1 << (bVar11 & 0x1f)) == 0)))))
               ) || ((piVar9[2] == 0 || (((piVar9[3] == 0 || (OVar3 == OVar5)) || (OVar4 == OVar6)))
                     )));
      OVar5 = opj_int_ceildiv(pi->x,res->pdx << (bVar10 & 0x1f));
      OVar5 = opj_int_floordivpow2(OVar5,*piVar9);
      OVar3 = opj_int_floordivpow2(OVar3,*piVar9);
      OVar6 = opj_int_ceildiv(pi->y,res->pdy << (bVar10 & 0x1f));
      OVar6 = opj_int_floordivpow2(OVar6,piVar9[1]);
      OVar4 = opj_int_floordivpow2(OVar4,piVar9[1]);
      pi->precno = (OVar5 - OVar3) + (OVar6 - OVar4) * piVar9[2];
      pi->layno = (pi->poc).layno0;
    }
    uVar7 = pi->layno * pi->step_l + pi->resno * pi->step_r + pi->compno * pi->step_c +
            pi->precno * pi->step_p;
    if (pi->include_size <= uVar7) {
      opj_pi_emit_error(pi,"Invalid access to pi->include");
      return 0;
    }
    if (pi->include[uVar7] == 0) {
      pi->include[uVar7] = 1;
      return 1;
    }
  } while( true );
}

Assistant:

static OPJ_BOOL opj_pi_next_cprl(opj_pi_iterator_t * pi)
{
    opj_pi_comp_t *comp = NULL;
    opj_pi_resolution_t *res = NULL;
    OPJ_UINT32 index = 0;

    if (!pi->first) {
        comp = &pi->comps[pi->compno];
        goto LABEL_SKIP;
    } else {
        pi->first = 0;
    }

    for (pi->compno = pi->poc.compno0; pi->compno < pi->poc.compno1; pi->compno++) {
        OPJ_UINT32 resno;
        comp = &pi->comps[pi->compno];
        pi->dx = 0;
        pi->dy = 0;
        for (resno = 0; resno < comp->numresolutions; resno++) {
            OPJ_UINT32 dx, dy;
            res = &comp->resolutions[resno];
            if (res->pdx + comp->numresolutions - 1 - resno < 32 &&
                    comp->dx <= UINT_MAX / (1u << (res->pdx + comp->numresolutions - 1 - resno))) {
                dx = comp->dx * (1u << (res->pdx + comp->numresolutions - 1 - resno));
                pi->dx = !pi->dx ? dx : opj_uint_min(pi->dx, dx);
            }
            if (res->pdy + comp->numresolutions - 1 - resno < 32 &&
                    comp->dy <= UINT_MAX / (1u << (res->pdy + comp->numresolutions - 1 - resno))) {
                dy = comp->dy * (1u << (res->pdy + comp->numresolutions - 1 - resno));
                pi->dy = !pi->dy ? dy : opj_uint_min(pi->dy, dy);
            }
        }
        if (pi->dx == 0 || pi->dy == 0) {
            return OPJ_FALSE;
        }
        if (!pi->tp_on) {
            pi->poc.ty0 = pi->ty0;
            pi->poc.tx0 = pi->tx0;
            pi->poc.ty1 = pi->ty1;
            pi->poc.tx1 = pi->tx1;
        }
        for (pi->y = pi->poc.ty0; pi->y < pi->poc.ty1;
                pi->y += (OPJ_INT32)(pi->dy - (OPJ_UINT32)(pi->y % (OPJ_INT32)pi->dy))) {
            for (pi->x = pi->poc.tx0; pi->x < pi->poc.tx1;
                    pi->x += (OPJ_INT32)(pi->dx - (OPJ_UINT32)(pi->x % (OPJ_INT32)pi->dx))) {
                for (pi->resno = pi->poc.resno0;
                        pi->resno < opj_uint_min(pi->poc.resno1, comp->numresolutions); pi->resno++) {
                    OPJ_UINT32 levelno;
                    OPJ_INT32 trx0, try0;
                    OPJ_INT32 trx1, try1;
                    OPJ_UINT32 rpx, rpy;
                    OPJ_INT32 prci, prcj;
                    res = &comp->resolutions[pi->resno];
                    levelno = comp->numresolutions - 1 - pi->resno;
                    /* Avoids division by zero on id_000004,sig_06,src_000679,op_arith8,pos_49,val_-17 */
                    /* of  https://github.com/uclouvain/openjpeg/issues/938 */
                    if (levelno >= 32 ||
                            ((comp->dx << levelno) >> levelno) != comp->dx ||
                            ((comp->dy << levelno) >> levelno) != comp->dy) {
                        continue;
                    }
                    if ((comp->dx << levelno) > INT_MAX ||
                            (comp->dy << levelno) > INT_MAX) {
                        continue;
                    }
                    trx0 = opj_int_ceildiv(pi->tx0, (OPJ_INT32)(comp->dx << levelno));
                    try0 = opj_int_ceildiv(pi->ty0, (OPJ_INT32)(comp->dy << levelno));
                    trx1 = opj_int_ceildiv(pi->tx1, (OPJ_INT32)(comp->dx << levelno));
                    try1 = opj_int_ceildiv(pi->ty1, (OPJ_INT32)(comp->dy << levelno));
                    rpx = res->pdx + levelno;
                    rpy = res->pdy + levelno;

                    /* To avoid divisions by zero / undefined behaviour on shift */
                    /* in below tests */
                    /* Fixes reading id:000019,sig:08,src:001098,op:flip1,pos:49 */
                    /* of https://github.com/uclouvain/openjpeg/issues/938 */
                    if (rpx >= 31 || ((comp->dx << rpx) >> rpx) != comp->dx ||
                            rpy >= 31 || ((comp->dy << rpy) >> rpy) != comp->dy) {
                        continue;
                    }

                    /* See ISO-15441. B.12.1.5 Component-position-resolution level-layer progression */
                    if (!((pi->y % (OPJ_INT32)(comp->dy << rpy) == 0) || ((pi->y == pi->ty0) &&
                            ((try0 << levelno) % (1 << rpy))))) {
                        continue;
                    }
                    if (!((pi->x % (OPJ_INT32)(comp->dx << rpx) == 0) || ((pi->x == pi->tx0) &&
                            ((trx0 << levelno) % (1 << rpx))))) {
                        continue;
                    }

                    if ((res->pw == 0) || (res->ph == 0)) {
                        continue;
                    }

                    if ((trx0 == trx1) || (try0 == try1)) {
                        continue;
                    }

                    prci = opj_int_floordivpow2(opj_int_ceildiv(pi->x,
                                                (OPJ_INT32)(comp->dx << levelno)), (OPJ_INT32)res->pdx)
                           - opj_int_floordivpow2(trx0, (OPJ_INT32)res->pdx);
                    prcj = opj_int_floordivpow2(opj_int_ceildiv(pi->y,
                                                (OPJ_INT32)(comp->dy << levelno)), (OPJ_INT32)res->pdy)
                           - opj_int_floordivpow2(try0, (OPJ_INT32)res->pdy);
                    pi->precno = (OPJ_UINT32)(prci + prcj * (OPJ_INT32)res->pw);
                    for (pi->layno = pi->poc.layno0; pi->layno < pi->poc.layno1; pi->layno++) {
                        index = pi->layno * pi->step_l + pi->resno * pi->step_r + pi->compno *
                                pi->step_c + pi->precno * pi->step_p;
                        if (index >= pi->include_size) {
                            opj_pi_emit_error(pi, "Invalid access to pi->include");
                            return OPJ_FALSE;
                        }
                        if (!pi->include[index]) {
                            pi->include[index] = 1;
                            return OPJ_TRUE;
                        }
LABEL_SKIP:
                        ;
                    }
                }
            }
        }
    }

    return OPJ_FALSE;
}